

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O2

void PDHG_Compute_Infeas_Residuals(CUPDLPwork *work)

{
  CUPDLPresobj *pCVar1;
  CUPDLPiterates *pCVar2;
  CUPDLPvec *pCVar3;
  CUPDLPvec *pCVar4;
  int iVar5;
  
  pCVar1 = work->resobj;
  pCVar2 = work->iterates;
  iVar5 = work->timers->nIter % 2;
  pCVar3 = pCVar2->x[iVar5];
  pCVar4 = pCVar2->ax[iVar5];
  PDHG_Compute_Primal_Infeasibility
            (work,pCVar2->y[iVar5]->data,pCVar1->dSlackPos,pCVar1->dSlackNeg,
             pCVar2->aty[iVar5]->data,pCVar1->dDualObj,&pCVar1->dPrimalInfeasObj,
             &pCVar1->dPrimalInfeasRes);
  PDHG_Compute_Dual_Infeasibility
            (work,pCVar3->data,pCVar4->data,pCVar1->dPrimalObj,&pCVar1->dDualInfeasObj,
             &pCVar1->dDualInfeasRes);
  PDHG_Compute_Primal_Infeasibility
            (work,pCVar2->yAverage->data,pCVar1->dSlackPosAverage,pCVar1->dSlackNegAverage,
             pCVar2->atyAverage->data,pCVar1->dDualObjAverage,&pCVar1->dPrimalInfeasObjAverage,
             &pCVar1->dPrimalInfeasResAverage);
  PDHG_Compute_Dual_Infeasibility
            (work,pCVar2->xAverage->data,pCVar2->axAverage->data,pCVar1->dPrimalObjAverage,
             &pCVar1->dDualInfeasObjAverage,&pCVar1->dDualInfeasResAverage);
  return;
}

Assistant:

void PDHG_Compute_Infeas_Residuals(CUPDLPwork *work) {
#if problem_USE_TIMERS
  ++problem->nComputeResidualsCalls;
  double dStartTime = getTimeStamp();
#endif
  CUPDLPiterates *iterates = work->iterates;
  CUPDLPresobj *resobj = work->resobj;


  cupdlp_int iter = work->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];
  CUPDLPvec *ax = iterates->ax[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];

  // current solution
  PDHG_Compute_Primal_Infeasibility(work, y->data, resobj->dSlackPos,
                                    resobj->dSlackNeg, aty->data,
                                    resobj->dDualObj, &resobj->dPrimalInfeasObj,
                                    &resobj->dPrimalInfeasRes);
  PDHG_Compute_Dual_Infeasibility(work, x->data, ax->data,
                                  resobj->dPrimalObj, &resobj->dDualInfeasObj,
                                  &resobj->dDualInfeasRes);

  // average solution
  PDHG_Compute_Primal_Infeasibility(
      work, iterates->yAverage->data, resobj->dSlackPosAverage,
      resobj->dSlackNegAverage, iterates->atyAverage->data,
      resobj->dDualObjAverage, &resobj->dPrimalInfeasObjAverage,
      &resobj->dPrimalInfeasResAverage);
  PDHG_Compute_Dual_Infeasibility(
      work, iterates->xAverage->data, iterates->axAverage->data,
      resobj->dPrimalObjAverage, &resobj->dDualInfeasObjAverage,
      &resobj->dDualInfeasResAverage);

#if problem_USE_TIMERS
  problem->dComputeResidualsTime += getTimeStamp() - dStartTime;
#endif
}